

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O0

void __thiscall imrt::Collimator::printAxisValues(Collimator *this)

{
  size_type sVar1;
  reference pvVar2;
  ostream *poVar3;
  long in_RDI;
  int i_1;
  int i;
  int local_10;
  int local_c;
  
  std::operator<<((ostream *)&std::cout,"x:");
  local_c = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60));
    if (sVar1 <= (ulong)(long)local_c) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),(long)local_c);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar2);
    std::operator<<(poVar3,",");
    local_c = local_c + 1;
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"y:");
  local_10 = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x78));
    if (sVar1 <= (ulong)(long)local_10) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x78),(long)local_10);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar2);
    std::operator<<(poVar3,",");
    local_10 = local_10 + 1;
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Collimator::printAxisValues() {
    cout << "x:";
    for (int i=0;i<xcoord.size(); i++ )
      cout << xcoord[i] << ",";
    cout << endl;
    cout << "y:";
    for (int i=0;i<ycoord.size(); i++ )
      cout << ycoord[i] << ",";
    cout << endl;
  }